

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::VariableScope::removeLive(VariableScope *this,Variable *variable)

{
  const_iterator local_38;
  Variable **local_30;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_28;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_20;
  iterator pos;
  Variable *variable_local;
  VariableScope *this_local;
  
  pos._M_current = (Variable **)variable;
  local_28._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(&this->m_liveVariables)
  ;
  local_30 = (Variable **)
             std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                       (&this->m_liveVariables);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,rsg::Variable_const*>
                       (local_28,(__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                                  )local_30,(Variable **)&pos);
  __gnu_cxx::
  __normal_iterator<rsg::Variable*const*,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>
  ::__normal_iterator<rsg::Variable**>
            ((__normal_iterator<rsg::Variable*const*,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>
              *)&local_38,&local_20);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::erase
            (&this->m_liveVariables,local_38);
  return;
}

Assistant:

void VariableScope::removeLive (const Variable* variable)
{
	vector<Variable*>::iterator pos = std::find(m_liveVariables.begin(), m_liveVariables.end(), variable);
	DE_ASSERT(pos != m_liveVariables.end());

	// \todo [pyry] Not so efficient
	m_liveVariables.erase(pos);
}